

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

bool __thiscall Varnode::copyShadow(Varnode *this,Varnode *op2)

{
  bool bVar1;
  OpCode OVar2;
  PcodeOp *pPVar3;
  bool bVar4;
  Varnode *local_28;
  Varnode *vn;
  Varnode *op2_local;
  Varnode *this_local;
  
  local_28 = this;
  if (this == op2) {
    return true;
  }
  while( true ) {
    bVar1 = isWritten(local_28);
    bVar4 = false;
    if (bVar1) {
      pPVar3 = getDef(local_28);
      OVar2 = PcodeOp::code(pPVar3);
      bVar4 = OVar2 == CPUI_COPY;
    }
    vn = op2;
    if (!bVar4) break;
    pPVar3 = getDef(local_28);
    local_28 = PcodeOp::getIn(pPVar3,0);
    if (local_28 == op2) {
      return true;
    }
  }
  while( true ) {
    bVar1 = isWritten(vn);
    bVar4 = false;
    if (bVar1) {
      pPVar3 = getDef(vn);
      OVar2 = PcodeOp::code(pPVar3);
      bVar4 = OVar2 == CPUI_COPY;
    }
    if (!bVar4) break;
    pPVar3 = getDef(vn);
    vn = PcodeOp::getIn(pPVar3,0);
    if (local_28 == vn) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Varnode::copyShadow(const Varnode *op2) const

{
  const Varnode *vn;

  if (this==op2) return true;
				// Trace -this- to the source of the copy chain
  vn = this;
  while( (vn->isWritten()) && (vn->getDef()->code() == CPUI_COPY)) {
    vn = vn->getDef()->getIn(0);
    if (vn == op2) return true;	// If we hit op2 then this and op2 must be the same
  }
				// Trace op2 to the source of copy chain
  while( (op2->isWritten()) && (op2->getDef()->code() == CPUI_COPY)) {
    op2 = op2->getDef()->getIn(0);
    if (vn == op2) return true;	// If the source is the same then this and op2 are same
  }
  return false;
}